

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3ced25::CFLTestWithData<unsigned_short>::randData
          (CFLTestWithData<unsigned_short> *this,offset_in_ACMRandom_to_subr random)

{
  unsigned_short uVar1;
  code *pcVar2;
  long in_RDX;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  
  if (0 < (this->super_CFLTest).height) {
    plVar6 = (long *)((long)this->data + in_RDX + -4);
    lVar5 = 0;
    do {
      if (0 < (this->super_CFLTest).width) {
        uVar3 = (ulong)((uint)lVar5 & 0x7ffffff);
        lVar4 = 0;
        do {
          pcVar2 = (code *)random;
          if ((random & 1) != 0) {
            pcVar2 = *(code **)(*plVar6 + -1 + random);
          }
          uVar1 = (*pcVar2)(plVar6);
          this->data[uVar3 * 0x20 + lVar4] = uVar1;
          this->data_ref[uVar3 * 0x20 + lVar4] = uVar1;
          lVar4 = lVar4 + 1;
        } while (lVar4 < (this->super_CFLTest).width);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_CFLTest).height);
  }
  return;
}

Assistant:

void randData(I (ACMRandom::*random)()) {
    for (int j = 0; j < this->height; j++) {
      for (int i = 0; i < this->width; i++) {
        const I d = (this->rnd.*random)();
        data[j * CFL_BUF_LINE + i] = d;
        data_ref[j * CFL_BUF_LINE + i] = d;
      }
    }
  }